

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::ArenaTest_CreateWithMoveArguments_Test::~ArenaTest_CreateWithMoveArguments_Test
          (ArenaTest_CreateWithMoveArguments_Test *this)

{
  ArenaTest_CreateWithMoveArguments_Test *this_local;
  
  ~ArenaTest_CreateWithMoveArguments_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(ArenaTest, CreateWithMoveArguments) {
  Arena arena;
  PleaseMoveMe one("1");
  const PleaseMoveMe* new_object =
      Arena::Create<PleaseMoveMe>(&arena, std::move(one));
  EXPECT_TRUE(new_object);
  ASSERT_EQ("1", new_object->value());
}